

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)

{
  long lVar1;
  avl_node *paVar2;
  long lVar3;
  stale_header_info sVar4;
  kvs_opened_node *e_00;
  filemgr_fhandle_idx_node *node;
  fdb_kvs_handle *pfVar5;
  __int_type _Var6;
  uint8_t *puVar7;
  long alStack_110 [9];
  undefined8 local_c8;
  __int_type local_c0 [3];
  char *new_filename;
  uint64_t dummy64;
  uint64_t num_keeping_headers;
  kvs_opened_node *item;
  list_elem *e;
  filemgr_fhandle_idx_node *fhandle_node;
  avl_node *a;
  fdb_file_handle *fhandle;
  fdb_seqnum_t seqnum;
  filemgr_magic_t magic;
  filemgr_header_revnum_t cur_revnum;
  filemgr_header_revnum_t hdr_revnum;
  bid_t last_wal_bid;
  bid_t hdr_bid;
  uint64_t n_headers;
  size_t hdr_len;
  size_t i;
  uint8_t *hdr_buf;
  fdb_kvs_handle *handle_local;
  stale_header_info ret;
  
  hdr_buf = (uint8_t *)handle;
  lVar3 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  i = (size_t)((long)&local_c8 + lVar3);
  a = (avl_node *)0x0;
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16baac;
  magic = std::__atomic_base::operator_cast_to_unsigned_long
                    (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
  handle_local = (fdb_kvs_handle *)magic;
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bacb;
  ret.revnum = std::__atomic_base::operator_cast_to_unsigned_long
                         (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
  lVar1 = *(long *)(hdr_buf + 0x48);
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bae3;
  pthread_spin_lock((pthread_spinlock_t *)(lVar1 + 0x2e8));
  lVar1 = *(long *)(hdr_buf + 0x48);
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16baf7;
  fhandle_node = (filemgr_fhandle_idx_node *)avl_first((avl_tree *)(lVar1 + 0x2d8));
  while (node = fhandle_node, fhandle_node != (filemgr_fhandle_idx_node *)0x0) {
    e = (list_elem *)&fhandle_node[-1].avl.right;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bb1b;
    fhandle_node = (filemgr_fhandle_idx_node *)avl_next((avl_node *)node);
    a = (avl_node *)e->prev;
    paVar2 = a + 1;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bb37;
    pthread_spin_lock((pthread_spinlock_t *)&paVar2->left);
    paVar2 = a->left;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bb44;
    item = (kvs_opened_node *)list_begin((list *)paVar2);
    while (e_00 = item, item != (kvs_opened_node *)0x0) {
      num_keeping_headers = (uint64_t)&item[-1].le.next;
      *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bb77;
      item = (kvs_opened_node *)list_next((list_elem *)e_00);
      if (*(long *)(*(long *)num_keeping_headers + 0x1a8) != 0) {
        *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bbaa;
        pfVar5 = (fdb_kvs_handle *)
                 std::__atomic_base::operator_cast_to_unsigned_long
                           (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
        if (pfVar5 < handle_local) {
          *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bbc6;
          handle_local = (fdb_kvs_handle *)
                         std::__atomic_base::operator_cast_to_unsigned_long
                                   (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
          *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bbe0;
          ret.revnum = std::__atomic_base::operator_cast_to_unsigned_long
                                 (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
        }
      }
    }
    paVar2 = a + 1;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bbf6;
    pthread_spin_unlock((pthread_spinlock_t *)&paVar2->left);
  }
  lVar1 = *(long *)(hdr_buf + 0x48);
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bc0f;
  pthread_spin_unlock((pthread_spinlock_t *)(lVar1 + 0x2e8));
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bc29;
  dummy64 = atomic_get_uint64_t(*(atomic<unsigned_long> **)((long)local_c0 + lVar3),
                                *(memory_order *)((long)&local_c8 + lVar3 + 4));
  if (dummy64 != 0) {
    local_c0[1] = ret.revnum;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bc59;
    _Var6 = std::__atomic_base::operator_cast_to_unsigned_long
                      (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
    if (local_c0[1] == _Var6) {
      *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bc82;
      last_wal_bid = atomic_get_uint64_t(*(atomic<unsigned_long> **)((long)local_c0 + lVar3),
                                         *(memory_order *)((long)&local_c8 + lVar3 + 4));
      cur_revnum = *(long *)(*(long *)(hdr_buf + 0x48) + 0x58) - 1;
    }
    else {
      last_wal_bid = ret.revnum;
      cur_revnum = (filemgr_header_revnum_t)handle_local;
    }
    if (magic - cur_revnum < dummy64) {
      hdr_bid = dummy64 - (magic - cur_revnum);
    }
    else {
      hdr_bid = 0;
    }
    for (hdr_len = 0; hdr_len < hdr_bid; hdr_len = hdr_len + 1) {
      puVar7 = hdr_buf + 0x168;
      *(undefined8 *)((long)alStack_110 + lVar3 + 0x28) = 0;
      *(fdb_seqnum_t **)((long)alStack_110 + lVar3 + 0x30) = &seqnum;
      *(undefined8 *)((long)alStack_110 + lVar3 + 0x38) = 0;
      *(uint8_t **)((long)alStack_110 + lVar3 + 0x40) = puVar7;
      *(undefined8 *)((long)alStack_110 + lVar3 + 0x20) = 0x16bd49;
      last_wal_bid = filemgr_fetch_prev_header
                               (*(filemgr **)(&stack0x00000008 + lVar3),
                                *(uint64_t *)(&stack0x00000000 + lVar3),
                                *(void **)((long)&ret + lVar3 + 8),*(size_t **)((long)&ret + lVar3),
                                *(fdb_seqnum_t **)((long)&handle_local + lVar3),
                                *(filemgr_header_revnum_t **)((long)&hdr_buf + lVar3),
                                *(uint64_t **)(&stack0x00000030 + lVar3),
                                *(uint64_t **)(&stack0x00000038 + lVar3),
                                *(uint64_t **)(&stack0x00000040 + lVar3),
                                *(err_log_callback **)(&stack0x00000048 + lVar3));
      if (n_headers == 0) break;
      handle_local = (fdb_kvs_handle *)cur_revnum;
      ret.revnum = last_wal_bid;
    }
    if (hdr_bid == 0) {
      ret.revnum = last_wal_bid;
      handle_local = (fdb_kvs_handle *)cur_revnum;
    }
  }
  local_c0[0] = ret.revnum;
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bdb3;
  _Var6 = std::__atomic_base::operator_cast_to_unsigned_long
                    (*(__atomic_base<unsigned_long> **)((long)local_c0 + lVar3 + 8));
  if (local_c0[0] == _Var6) {
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0x16bde3;
    filemgr_get_header(*(filemgr **)((long)&dummy64 + lVar3),*(void **)((long)&new_filename + lVar3)
                       ,*(size_t **)((long)local_c0 + lVar3 + 0x10),
                       *(bid_t **)((long)local_c0 + lVar3 + 8),
                       *(fdb_seqnum_t **)((long)local_c0 + lVar3),
                       *(filemgr_header_revnum_t **)((long)&local_c8 + lVar3));
    if (n_headers == 0) {
      ret.revnum = 0xffffffffffffffff;
      handle_local = (fdb_kvs_handle *)0x0;
      goto LAB_0016bf3d;
    }
  }
  else {
    puVar7 = hdr_buf + 0x168;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x28) = 0;
    *(fdb_seqnum_t **)((long)alStack_110 + lVar3 + 0x30) = &seqnum;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x38) = 0;
    *(uint8_t **)((long)alStack_110 + lVar3 + 0x40) = puVar7;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x20) = 0x16be52;
    filemgr_fetch_header
              (*(filemgr **)((long)&last_wal_bid + lVar3),*(uint64_t *)((long)&hdr_revnum + lVar3),
               *(void **)((long)&cur_revnum + lVar3),*(size_t **)((long)&magic + lVar3),
               *(fdb_seqnum_t **)((long)&seqnum + lVar3),
               *(filemgr_header_revnum_t **)((long)&fhandle + lVar3),
               *(uint64_t **)((long)&hdr_buf + lVar3),*(uint64_t **)((long)&handle_local + lVar3),
               *(uint64_t **)((long)&ret + lVar3),*(err_log_callback **)((long)&ret + lVar3 + 8));
  }
  local_c8 = &new_filename;
  *(char ***)((long)alStack_110 + lVar3 + 8) = &new_filename;
  *(char ***)((long)alStack_110 + lVar3 + 0x10) = &new_filename;
  *(char ***)((long)alStack_110 + lVar3 + 0x18) = &new_filename;
  *(filemgr_header_revnum_t **)((long)alStack_110 + lVar3 + 0x20) = &hdr_revnum;
  *(char ***)((long)alStack_110 + lVar3 + 0x28) = &new_filename;
  *(char ***)((long)alStack_110 + lVar3 + 0x30) = &new_filename;
  *(__int_type **)((long)alStack_110 + lVar3 + 0x38) = local_c0 + 2;
  *(undefined8 *)((long)alStack_110 + lVar3 + 0x40) = 0;
  *(undefined8 *)((long)alStack_110 + lVar3) = 0x16beb9;
  fdb_fetch_header(*(uint64_t *)((long)alStack_110 + lVar3 + 0x40),
                   *(void **)((long)alStack_110 + lVar3 + 0x38),
                   *(bid_t **)((long)alStack_110 + lVar3 + 0x30),
                   *(bid_t **)((long)alStack_110 + lVar3 + 0x28),
                   *(bid_t **)((long)alStack_110 + lVar3 + 0x20),
                   *(uint64_t **)((long)alStack_110 + lVar3 + 0x18),
                   *(uint64_t **)((long)local_c0 + lVar3),*(uint64_t **)((long)local_c0 + lVar3 + 8)
                   ,*(uint64_t **)((long)local_c0 + lVar3 + 0x10),
                   *(uint64_t **)((long)&new_filename + lVar3),
                   *(uint64_t **)((long)&dummy64 + lVar3),
                   *(uint64_t **)((long)&num_keeping_headers + lVar3),
                   *(char ***)((long)&item + lVar3),*(char ***)((long)&e + lVar3));
  if (hdr_revnum == 0xffffffffffffffff) {
    ret.revnum = 0xffffffffffffffff;
    handle_local = (fdb_kvs_handle *)0x0;
  }
  else {
    puVar7 = hdr_buf + 0x168;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x28) = 0;
    *(fdb_seqnum_t **)((long)alStack_110 + lVar3 + 0x30) = &seqnum;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x38) = 0;
    *(uint8_t **)((long)alStack_110 + lVar3 + 0x40) = puVar7;
    *(undefined8 *)((long)alStack_110 + lVar3 + 0x20) = 0x16bf15;
    filemgr_fetch_header
              (*(filemgr **)((long)&last_wal_bid + lVar3),*(uint64_t *)((long)&hdr_revnum + lVar3),
               *(void **)((long)&cur_revnum + lVar3),*(size_t **)((long)&magic + lVar3),
               *(fdb_seqnum_t **)((long)&seqnum + lVar3),
               *(filemgr_header_revnum_t **)((long)&fhandle + lVar3),
               *(uint64_t **)((long)&hdr_buf + lVar3),*(uint64_t **)((long)&handle_local + lVar3),
               *(uint64_t **)((long)&ret + lVar3),*(err_log_callback **)((long)&ret + lVar3 + 8));
    ret.revnum = hdr_revnum;
    handle_local = (fdb_kvs_handle *)cur_revnum;
  }
LAB_0016bf3d:
  sVar4.bid = ret.revnum;
  sVar4.revnum = (filemgr_header_revnum_t)handle_local;
  return sVar4;
}

Assistant:

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)
{
    uint8_t *hdr_buf = alca(uint8_t, handle->config.blocksize);
    size_t i, hdr_len;
    uint64_t n_headers;
    bid_t hdr_bid, last_wal_bid;
    filemgr_header_revnum_t hdr_revnum;
    filemgr_header_revnum_t cur_revnum;
    filemgr_magic_t magic;
    fdb_seqnum_t seqnum;
    fdb_file_handle *fhandle = NULL;
    stale_header_info ret;
    struct avl_node *a;
    struct filemgr_fhandle_idx_node *fhandle_node;
    struct list_elem *e;
    struct kvs_opened_node *item;

    ret.revnum = cur_revnum = handle->fhandle->root->cur_header_revnum;
    ret.bid = handle->fhandle->root->last_hdr_bid;

    spin_lock(&handle->file->fhandle_idx_lock);

    // check all opened file handles
    a = avl_first(&handle->file->fhandle_idx);
    while (a) {
        fhandle_node = _get_entry(a, struct filemgr_fhandle_idx_node, avl);
        a = avl_next(a);

        fhandle = (fdb_file_handle*)fhandle_node->fhandle;
        spin_lock(&fhandle->lock);
        // check all opened KVS handles belonging to the file handle
        e = list_begin(fhandle->handles);
        while (e) {

            item = _get_entry(e, struct kvs_opened_node, le);
            e = list_next(e);

            if (!item->handle->shandle) {
                // Only consider active snapshot handles since non-snapshot
                // handles will get synced upon their next forestdb api call.
                // This prevents "lazy" non-snapshot handles from holding up
                // stale block reclaim.
                continue;
            }

            if (item->handle->cur_header_revnum < ret.revnum) {
                ret.revnum = item->handle->cur_header_revnum;
                ret.bid = item->handle->last_hdr_bid;
            }
        }
        spin_unlock(&fhandle->lock);
    }

    spin_unlock(&handle->file->fhandle_idx_lock);

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);
    if (num_keeping_headers) {
        // backward scan previous header info to keep more headers

        if (ret.bid == handle->last_hdr_bid) {
            // header in 'handle->last_hdr_bid' is not written into file yet!
            // we should start from the previous header
            hdr_bid = atomic_get_uint64_t(&handle->file->header.bid);
            hdr_revnum = handle->file->header.revnum - 1;
        } else {
            hdr_bid = ret.bid;
            hdr_revnum = ret.revnum;
        }

        n_headers= num_keeping_headers;
        if (cur_revnum - hdr_revnum < n_headers) {
            n_headers = n_headers - (cur_revnum - hdr_revnum);
        } else {
            n_headers = 0;
        }

        for (i=0; i<n_headers; ++i) {
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                         hdr_buf, &hdr_len, &seqnum, &hdr_revnum, NULL,
                         &magic, NULL, &handle->log_callback);
            if (hdr_len) {
                ret.revnum = hdr_revnum;
                ret.bid = hdr_bid;
            } else {
                break;
            }
        }
        if (!n_headers) {
            ret.bid = hdr_bid;
            ret.revnum = hdr_revnum;
        }
    }

    // although we keep more headers from the oldest active header, we have to
    // preserve the last WAL flushing header from the target header for data
    // consistency.
    uint64_t dummy64;
    char *new_filename;

    if (ret.bid == handle->last_hdr_bid) {
        // The latest header (that is not written yet) is the
        // only one that we can reclaim. Read from memory.
        filemgr_get_header(handle->file, hdr_buf, &hdr_len, NULL, &seqnum, &hdr_revnum);
        if (!hdr_len) {
            ret.bid = BLK_NOT_FOUND;
            ret.revnum = 0;
            return ret;
        }
    } else {
        filemgr_fetch_header(handle->file, ret.bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
    }
    fdb_fetch_header(magic, hdr_buf, &dummy64, &dummy64, &dummy64, &dummy64,
                     &dummy64, &dummy64, &dummy64, &last_wal_bid, &dummy64,
                     &dummy64, &new_filename, NULL);

    if (last_wal_bid != BLK_NOT_FOUND) {
        filemgr_fetch_header(handle->file, last_wal_bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
        ret.bid = last_wal_bid;
        ret.revnum = hdr_revnum;
    } else {
        // WAL has not been flushed yet .. we cannot trigger block reusing
        ret.bid = BLK_NOT_FOUND;
        ret.revnum = 0;
    }

    return ret;
}